

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

char * Dau_ParseFormulaEndToken(char *pForm)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = pForm + 1;
  iVar2 = 0;
  do {
    cVar1 = pcVar3[-1];
    if (cVar1 == '(') {
      iVar2 = iVar2 + 1;
LAB_0043c999:
      if (iVar2 == 0) {
        return pcVar3;
      }
    }
    else {
      if (cVar1 == ')') {
        iVar2 = iVar2 + -1;
        goto LAB_0043c999;
      }
      if (cVar1 != '~') {
        if (cVar1 == '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                        ,0x5d,"char *Dau_ParseFormulaEndToken(char *)");
        }
        goto LAB_0043c999;
      }
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

char * Dau_ParseFormulaEndToken( char * pForm )
{
    int Counter = 0;
    char * pThis;
    for ( pThis = pForm; *pThis; pThis++ )
    {
        if ( *pThis == '~' )
            continue;
        if ( *pThis == '(' )
            Counter++;
        else if ( *pThis == ')' )
            Counter--;
        if ( Counter == 0 )
            return pThis + 1;
    }
    assert( 0 );
    return NULL;
}